

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall
I2sAnalyzer::GetNextBit(I2sAnalyzer *this,BitState *data,BitState *frame,U64 *sample_number)

{
  MarkerType MVar1;
  BitState BVar2;
  U64 UVar3;
  element_type *peVar4;
  U64 data_valid_sample;
  U64 *sample_number_local;
  BitState *frame_local;
  BitState *data_local;
  I2sAnalyzer *this_local;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar3 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
  BVar2 = AnalyzerChannelData::GetBitState();
  *data = BVar2;
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mFrame);
  BVar2 = AnalyzerChannelData::GetBitState();
  *frame = BVar2;
  *sample_number = UVar3;
  peVar4 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
  MVar1 = this->mArrowMarker;
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddMarker((ulonglong)peVar4,(MarkerType)UVar3,(Channel *)(ulong)MVar1);
  AnalyzerChannelData::AdvanceToNextEdge();
  return;
}

Assistant:

void I2sAnalyzer::GetNextBit( BitState& data, BitState& frame, U64& sample_number )
{
    // we always start off here so that the next edge is where the data is valid.
    mClock->AdvanceToNextEdge();
    U64 data_valid_sample = mClock->GetSampleNumber();

    mData->AdvanceToAbsPosition( data_valid_sample );
    data = mData->GetBitState();

    mFrame->AdvanceToAbsPosition( data_valid_sample );
    frame = mFrame->GetBitState();

    sample_number = data_valid_sample;

    mResults->AddMarker( data_valid_sample, mArrowMarker, mSettings->mClockChannel );

    mClock->AdvanceToNextEdge(); // advance one more, so we're ready for next this function is called.
}